

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

istream * __thiscall nivalis::Expr::from_bin(Expr *this,istream *is)

{
  size_type in_RAX;
  pointer pAVar1;
  ulong uVar2;
  long lVar3;
  size_t sz;
  size_type local_28;
  
  local_28 = in_RAX;
  std::istream::read((char *)is,(long)&local_28);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (&this->ast,local_28);
  pAVar1 = (this->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ast).
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      std::istream::read((char *)is,(long)&pAVar1->opcode + lVar3);
      uVar2 = uVar2 + 1;
      pAVar1 = (this->ast).
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->ast).
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4));
  }
  return is;
}

Assistant:

std::istream& Expr::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, ast);
    for (size_t i = 0; i < ast.size(); ++i) {
        util::read_bin(is, ast[i]);
    }
    return is;
}